

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_1::PosixMmapReadableFile::~PosixMmapReadableFile(PosixMmapReadableFile *this)

{
  PosixMmapReadableFile *this_local;
  
  munmap(this->mmap_base_,this->length_);
  Limiter::Release(this->mmap_limiter_);
  std::__cxx11::string::~string((string *)&this->filename_);
  RandomAccessFile::~RandomAccessFile(&this->super_RandomAccessFile);
  return;
}

Assistant:

~PosixMmapReadableFile() override {
    ::munmap(static_cast<void*>(mmap_base_), length_);
    mmap_limiter_->Release();
  }